

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# build_test.cc
# Opt level: O0

void __thiscall PlanTestPoolWithDepthOne::~PlanTestPoolWithDepthOne(PlanTestPoolWithDepthOne *this)

{
  PlanTestPoolWithDepthOne *this_local;
  
  PlanTest::~PlanTest(&this->super_PlanTest);
  return;
}

Assistant:

TEST_F(PlanTest, PoolWithDepthOne) {
  TestPoolWithDepthOne(
"pool foobar\n"
"  depth = 1\n"
"rule poolcat\n"
"  command = cat $in > $out\n"
"  pool = foobar\n"
"build out1: poolcat in\n"
"build out2: poolcat in\n");
}